

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O3

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::Phase(Phase<std::complex<float>_> *this,real_type theta)

{
  float fVar1;
  
  (this->super_QGate1<std::complex<float>_>).qubit_ = 0;
  (this->super_QGate1<std::complex<float>_>).field_0xc = 0;
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004ebc10;
  fVar1 = cosf(theta);
  (this->angle_).cos_ = fVar1;
  fVar1 = sinf(theta);
  (this->angle_).sin_ = fVar1;
  return;
}

Assistant:

Phase( const real_type theta )
        : QGate1< T >( 0 )
        , angle_( theta )
        , QAdjustable( false )
        { }